

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  size_t sVar2;
  path_node_type *ppVar3;
  fd_set *__exceptfds_00;
  undefined7 extraout_var;
  size_t i;
  ulong index;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *item;
  result_options in_stack_00000008;
  string_view_type local_60;
  object_range_type local_50;
  
  context = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  if (bVar1) {
    base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::tail_select(&this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  ,context,(reference)__readfds,(path_node_type *)__writefds,(reference)__exceptfds,
                  (node_receiver_type *)__timeout,in_stack_00000008);
    index = 0;
    while( true ) {
      sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if (sVar2 <= index) break;
      ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate(context,(path_node_type *)__writefds,index,in_stack_00000008);
      __exceptfds_00 =
           (fd_set *)
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                     ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      __exceptfds,index);
      select(this,__nfds,__readfds,(fd_set *)ppVar3,__exceptfds_00,__timeout);
      index = index + 1;
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    sVar2 = CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select(&this->
                     super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ,context,(reference)__readfds,(path_node_type *)__writefds,
                    (reference)__exceptfds,(node_receiver_type *)__timeout,in_stack_00000008);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (&local_50,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)__exceptfds);
      while( true ) {
        bVar1 = local_50.first_.has_value_ == local_50.last_.has_value_;
        if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
          bVar1 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
        }
        sVar2 = (size_t)bVar1;
        if (bVar1 == true) break;
        local_60._M_str = ((local_50.first_.it_._M_current)->key_)._M_dataplus._M_p;
        local_60._M_len = ((local_50.first_.it_._M_current)->key_)._M_string_length;
        ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate(context,(path_node_type *)__writefds,&local_60,in_stack_00000008);
        select(this,__nfds,__readfds,(fd_set *)ppVar3,
               (fd_set *)&(local_50.first_.it_._M_current)->value_,__timeout);
        local_50.first_.it_._M_current = local_50.first_.it_._M_current + 1;
      }
    }
  }
  return (int)sVar2;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_array())
            {
                this->tail_select(context, root, last, current, receiver, options);
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    select(context, root, 
                           path_generator_type::generate(context, last, i, options), current[i], receiver, options);
                }
            }
            else if (current.is_object())
            {
                this->tail_select(context, root, last, current, receiver, options);
                for (auto& item : current.object_range())
                {
                    select(context, root, 
                           path_generator_type::generate(context, last, item.key(), options), item.value(), receiver, options);
                }
            }
            //std::cout << "end wildcard_selector\n";
        }